

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

Group * metaf::GroupParser::reparseAlternative<8ul>
                  (string *group,ReportPart reportPart,ReportMetadata *reportMetadata,
                  size_t ignoreIndex)

{
  bool bVar1;
  TemperatureGroup *in_RDI;
  string *in_R8;
  optional<metaf::TemperatureGroup> parsed;
  ReportMetadata *in_stack_00000190;
  ReportPart in_stack_0000019c;
  string *in_stack_000001a0;
  TemperatureGroup *this;
  size_t in_stack_ffffffffffffffc8;
  ReportMetadata *in_stack_ffffffffffffffd0;
  ReportPart in_stack_ffffffffffffffdc;
  
  this = in_RDI;
  if (in_R8 != (string *)0x8) {
    TemperatureGroup::parse(in_stack_000001a0,in_stack_0000019c,in_stack_00000190);
    bVar1 = std::optional<metaf::TemperatureGroup>::has_value
                      ((optional<metaf::TemperatureGroup> *)0x2580ee);
    if (bVar1) {
      std::optional<metaf::TemperatureGroup>::operator*
                ((optional<metaf::TemperatureGroup> *)0x2580fe);
      std::
      variant<metaf::KeywordGroup,metaf::LocationGroup,metaf::ReportTimeGroup,metaf::TrendGroup,metaf::WindGroup,metaf::VisibilityGroup,metaf::CloudGroup,metaf::WeatherGroup,metaf::TemperatureGroup,metaf::PressureGroup,metaf::RunwayStateGroup,metaf::SeaSurfaceGroup,metaf::MinMaxTemperatureGroup,metaf::PrecipitationGroup,metaf::LayerForecastGroup,metaf::PressureTendencyGroup,metaf::CloudTypesGroup,metaf::LowMidHighCloudGroup,metaf::LightningGroup,metaf::VicinityGroup,metaf::MiscGroup,metaf::UnknownGroup>
      ::variant<metaf::TemperatureGroup_const&,void,void,metaf::TemperatureGroup,void>
                ((variant<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
                  *)this,in_RDI);
      return (Group *)this;
    }
  }
  reparseAlternative<9ul>
            (in_R8,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  return (Group *)this;
}

Assistant:

static Group reparseAlternative(const std::string & group,
		ReportPart reportPart,
		const ReportMetadata & reportMetadata,
		size_t ignoreIndex)
	{
		using Alternative = std::variant_alternative_t<I, Group>;
		if constexpr (!std::is_same<Alternative, FallbackGroup>::value) {
			if (I != ignoreIndex) {
				const auto parsed = Alternative::parse(group, reportPart, reportMetadata);
				if (parsed.has_value()) return *parsed;
			}
		}
		if constexpr (I >= (std::variant_size_v<Group> - 1)) {
			return FallbackGroup();
		} else {
			return reparseAlternative<I+1>(group, reportPart, reportMetadata, ignoreIndex);
		}
	}